

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

Am_Wrapper * ship_color_proc(Am_Object *self)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Style *this;
  Am_Object AStack_18;
  
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    pAVar4 = (Am_Value *)Am_Object::Get(0xf0a8,0x87);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
      return pAVar5;
    }
  }
  Am_Object::Get_Object((ushort)&AStack_18,(ulong)self);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&AStack_18,(ulong)SHIP_TYPE);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object(&AStack_18);
  if (iVar3 == 2) {
    this = (Am_Style *)&Am_Green;
  }
  else {
    if (iVar3 != 1) {
      return (Am_Wrapper *)0x0;
    }
    this = (Am_Style *)&SP_Federation_Blue;
  }
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(this);
  return pAVar5;
}

Assistant:

Am_Define_Style_Formula(ship_color)
{
  if (Am_Screen.Valid())
    if (!(bool)Am_Screen.Get(Am_IS_COLOR))
      return Am_White;
  SP_Ship_Type st = (int)(self.Get_Owner().Get(SHIP_TYPE));
  if (st == FEDERATION)
    return (SP_Federation_Blue);
  else if (st == KLINGON)
    return (Am_Green);
  else {
    //Am_Error("ship_color: Invalid ship type.\n");
    return nullptr;
  }
}